

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QWindow_*>::data(QList<QWindow_*> *this)

{
  QArrayDataPointer<QWindow_*> *this_00;
  QWindow **ppQVar1;
  QArrayDataPointer<QWindow_*> *in_RDI;
  
  detach((QList<QWindow_*> *)0x12fcac);
  this_00 = (QArrayDataPointer<QWindow_*> *)QArrayDataPointer<QWindow_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QWindow_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }